

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util_test.cc
# Opt level: O0

Header __thiscall
google::protobuf::internal::anon_unknown_0::ExtractHeader
          (anon_unknown_0 *this,Span<const_unsigned_int> data)

{
  Header HVar1;
  reference puVar2;
  reference pvVar3;
  array<unsigned_short,_2UL> local_30;
  array<unsigned_short,_2UL> local_2c;
  array<unsigned_short,_2UL> local_28;
  array<unsigned_short,_2UL> local_24;
  undefined1 local_20 [8];
  Span<const_unsigned_int> data_local;
  
  data_local.ptr_ = data.ptr_;
  local_20 = (undefined1  [8])this;
  puVar2 = absl::lts_20250127::Span<const_unsigned_int>::operator[]
                     ((Span<const_unsigned_int> *)local_20,0);
  local_24 = Unmake32(*puVar2);
  pvVar3 = std::array<unsigned_short,_2UL>::operator[](&local_24,0);
  data_local.len_._0_2_ = *pvVar3;
  puVar2 = absl::lts_20250127::Span<const_unsigned_int>::operator[]
                     ((Span<const_unsigned_int> *)local_20,0);
  local_28 = Unmake32(*puVar2);
  pvVar3 = std::array<unsigned_short,_2UL>::operator[](&local_28,1);
  data_local.len_._2_2_ = *pvVar3;
  puVar2 = absl::lts_20250127::Span<const_unsigned_int>::operator[]
                     ((Span<const_unsigned_int> *)local_20,1);
  local_2c = Unmake32(*puVar2);
  pvVar3 = std::array<unsigned_short,_2UL>::operator[](&local_2c,0);
  data_local.len_._4_2_ = *pvVar3;
  puVar2 = absl::lts_20250127::Span<const_unsigned_int>::operator[]
                     ((Span<const_unsigned_int> *)local_20,1);
  local_30 = Unmake32(*puVar2);
  pvVar3 = std::array<unsigned_short,_2UL>::operator[](&local_30,1);
  HVar1.sequence_length = data_local.len_._2_2_;
  HVar1.sequence_start = (value_type_conflict4)data_local.len_;
  HVar1.bitmap_length = data_local.len_._4_2_;
  HVar1.ordered_length = *pvVar3;
  return HVar1;
}

Assistant:

Header ExtractHeader(absl::Span<const uint32_t> data) {
  return {
      static_cast<int16_t>(Unmake32(data[0])[0]),
      Unmake32(data[0])[1],
      Unmake32(data[1])[0],
      Unmake32(data[1])[1],
  };
}